

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::List<CaseNode_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Sort(List<CaseNode_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this
    ,_func_int_void_ptr_void_ptr_void_ptr *_PtFuncCompare,void *_Context)

{
  void *_Context_local;
  _func_int_void_ptr_void_ptr_void_ptr *_PtFuncCompare_local;
  List<CaseNode_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_local;
  
  if ((this->super_ReadOnlyList<CaseNode_*,_Memory::JitArenaAllocator,_DefaultComparer>).count != 0)
  {
    _Context_local = _PtFuncCompare;
    _PtFuncCompare_local = (_func_int_void_ptr_void_ptr_void_ptr *)this;
    qsort_s<CaseNode*,CaseNode*,Memory::JitArenaAllocator,int(*)(void*,void_const*,void_const*)>
              ((this->super_ReadOnlyList<CaseNode_*,_Memory::JitArenaAllocator,_DefaultComparer>).
               buffer,(long)(this->
                            super_ReadOnlyList<CaseNode_*,_Memory::JitArenaAllocator,_DefaultComparer>
                            ).count,(_func_int_void_ptr_void_ptr_void_ptr **)&_Context_local,
               _Context);
  }
  return;
}

Assistant:

void Sort(int(__cdecl * _PtFuncCompare)(void *, const void *, const void *), void *_Context)
        {
            // We can call QSort only if the remove policy for this list is CopyRemovePolicy
            CompileAssert((IsSame<TRemovePolicyType, Js::CopyRemovePolicy<TListType, false> >::IsTrue) ||
                (IsSame<TRemovePolicyType, Js::CopyRemovePolicy<TListType, true> >::IsTrue));
            if (this->count)
            {
                qsort_s<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    this->buffer, this->count, _PtFuncCompare, _Context);
            }
        }